

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

void Pdr_ManDeriveResult(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vCi2Rem,
                        Vec_Int_t *vRes,Vec_Int_t *vPiLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int local_44;
  int Lit;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vPiLits_local;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vCi2Rem_local;
  Vec_Int_t *vCiVals_local;
  Vec_Int_t *vCiObjs_local;
  Aig_Man_t *pAig_local;
  
  Aig_ManIncrementTravId(pAig);
  for (local_44 = 0; iVar1 = Vec_IntSize(vCi2Rem), local_44 < iVar1; local_44 = local_44 + 1) {
    iVar1 = Vec_IntEntry(vCi2Rem,local_44);
    pAVar4 = Aig_ManObj(pAig,iVar1);
    iVar1 = Saig_ObjIsLo(pAig,pAVar4);
    if (iVar1 == 0) {
      __assert_fail("Saig_ObjIsLo( pAig, pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                    ,0x11a,
                    "void Pdr_ManDeriveResult(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Aig_ObjSetTravIdCurrent(pAig,pAVar4);
  }
  Vec_IntClear(vRes);
  Vec_IntClear(vPiLits);
  local_44 = 0;
  do {
    iVar1 = Vec_IntSize(vCiObjs);
    if (iVar1 <= local_44) {
      iVar1 = Vec_IntSize(vRes);
      if (iVar1 == 0) {
        Vec_IntPush(vRes,0);
      }
      return;
    }
    iVar1 = Vec_IntEntry(vCiObjs,local_44);
    pAVar4 = Aig_ManObj(pAig,iVar1);
    iVar1 = Saig_ObjIsPi(pAig,pAVar4);
    if (iVar1 == 0) {
      iVar1 = Saig_ObjIsLo(pAig,pAVar4);
      if (iVar1 == 0) {
        __assert_fail("Saig_ObjIsLo(pAig, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                      ,0x128,
                      "void Pdr_ManDeriveResult(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Aig_ObjIsTravIdCurrent(pAig,pAVar4);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjCioId(pAVar4);
        iVar2 = Saig_ManPiNum(pAig);
        iVar3 = Vec_IntEntry(vCiVals,local_44);
        iVar1 = Abc_Var2Lit(iVar1 - iVar2,(uint)(iVar3 == 0));
        Vec_IntPush(vRes,iVar1);
      }
    }
    else {
      iVar1 = Aig_ObjCioId(pAVar4);
      iVar2 = Vec_IntEntry(vCiVals,local_44);
      iVar1 = Abc_Var2Lit(iVar1,(uint)(iVar2 == 0));
      Vec_IntPush(vPiLits,iVar1);
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void Pdr_ManDeriveResult( Aig_Man_t * pAig, Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vCi2Rem, Vec_Int_t * vRes, Vec_Int_t * vPiLits )
{
    Aig_Obj_t * pObj;
    int i, Lit;
    // mark removed flop outputs
    Aig_ManIncrementTravId( pAig );
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
    {
        assert( Saig_ObjIsLo( pAig, pObj ) );
        Aig_ObjSetTravIdCurrent(pAig, pObj);
    }
    // collect flop outputs that are not marked
    Vec_IntClear( vRes );
    Vec_IntClear( vPiLits );
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
    {
        if ( Saig_ObjIsPi(pAig, pObj) )
        {
            Lit = Abc_Var2Lit( Aig_ObjCioId(pObj), (Vec_IntEntry(vCiVals, i) == 0) );
            Vec_IntPush( vPiLits, Lit );
            continue;
        }
        assert( Saig_ObjIsLo(pAig, pObj) );
        if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
            continue;
        Lit = Abc_Var2Lit( Aig_ObjCioId(pObj) - Saig_ManPiNum(pAig), (Vec_IntEntry(vCiVals, i) == 0) );
        Vec_IntPush( vRes, Lit );
    }
    if ( Vec_IntSize(vRes) == 0 )
        Vec_IntPush(vRes, 0);
}